

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transport.cpp
# Opt level: O2

void __thiscall adios2::Transport::InitProfiler(Transport *this,Mode openMode,TimeUnit timeUnit)

{
  IOChrono *pIVar1;
  allocator local_221;
  undefined1 local_220 [160];
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  Timer local_c0;
  
  (this->m_Profiler).m_IsActive = true;
  std::__cxx11::string::string((string *)&local_e0,"open",&local_221);
  profiling::Timer::Timer(&local_c0,&local_e0,Microseconds,false);
  local_220._0_8_ = "open";
  profiling::Timer::Timer((Timer *)(local_220 + 8),&local_c0);
  pIVar1 = &this->m_Profiler;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<char_const*,adios2::profiling::Timer>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)pIVar1,local_220);
  profiling::Timer::~Timer((Timer *)(local_220 + 8));
  profiling::Timer::~Timer(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (openMode == Append) {
    std::__cxx11::string::string((string *)&local_120,"write",(allocator *)&local_c0);
    profiling::Timer::Timer((Timer *)local_220,&local_120,timeUnit,false);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<char_const(&)[6],adios2::profiling::Timer>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)pIVar1,"write",local_220);
    profiling::Timer::~Timer((Timer *)local_220);
    std::__cxx11::string::~string((string *)&local_120);
    local_220._0_8_ = local_220._0_8_ & 0xffffffff00000000;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<char_const(&)[6],int>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this->m_Profiler).m_Bytes,"write",local_220);
    std::__cxx11::string::string((string *)&local_140,"read",(allocator *)&local_c0);
    profiling::Timer::Timer((Timer *)local_220,&local_140,timeUnit,false);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<char_const(&)[5],adios2::profiling::Timer>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)pIVar1,"read",local_220);
    profiling::Timer::~Timer((Timer *)local_220);
    std::__cxx11::string::~string((string *)&local_140);
  }
  else {
    if (openMode != Read) {
      if (openMode == Write) {
        std::__cxx11::string::string((string *)&local_100,"write",(allocator *)&local_c0);
        profiling::Timer::Timer((Timer *)local_220,&local_100,timeUnit,false);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<char_const(&)[6],adios2::profiling::Timer>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)pIVar1,"write",local_220);
        profiling::Timer::~Timer((Timer *)local_220);
        std::__cxx11::string::~string((string *)&local_100);
        local_220._0_8_ = local_220._0_8_ & 0xffffffff00000000;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<char_const(&)[6],int>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&(this->m_Profiler).m_Bytes,"write",local_220);
      }
      goto LAB_005f621b;
    }
    std::__cxx11::string::string((string *)&local_160,"read",(allocator *)&local_c0);
    profiling::Timer::Timer((Timer *)local_220,&local_160,timeUnit,false);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<char_const(&)[5],adios2::profiling::Timer>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)pIVar1,"read",local_220);
    profiling::Timer::~Timer((Timer *)local_220);
    std::__cxx11::string::~string((string *)&local_160);
  }
  local_220._0_8_ = local_220._0_8_ & 0xffffffff00000000;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<char_const(&)[5],int>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&(this->m_Profiler).m_Bytes,"read",local_220);
LAB_005f621b:
  std::__cxx11::string::string((string *)&local_180,"close",(allocator *)&local_c0);
  profiling::Timer::Timer((Timer *)local_220,&local_180,Microseconds,false);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<char_const(&)[6],adios2::profiling::Timer>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)pIVar1,"close",local_220);
  profiling::Timer::~Timer((Timer *)local_220);
  std::__cxx11::string::~string((string *)&local_180);
  return;
}

Assistant:

void Transport::InitProfiler(const Mode openMode, const TimeUnit timeUnit)
{
    m_Profiler.m_IsActive = true;

    m_Profiler.m_Timers.emplace(
        std::make_pair("open", profiling::Timer("open", TimeUnit::Microseconds)));

    if (openMode == Mode::Write)
    {
        m_Profiler.m_Timers.emplace("write", profiling::Timer("write", timeUnit));

        m_Profiler.m_Bytes.emplace("write", 0);
    }
    else if (openMode == Mode::Append)
    {
        /*
        m_Profiler.Timers.emplace(
            "append", profiling::Timer("append", timeUnit));
        m_Profiler.Bytes.emplace("append", 0);
        */
        m_Profiler.m_Timers.emplace("write", profiling::Timer("write", timeUnit));

        m_Profiler.m_Bytes.emplace("write", 0);

        m_Profiler.m_Timers.emplace("read", profiling::Timer("read", timeUnit));

        m_Profiler.m_Bytes.emplace("read", 0);
    }
    else if (openMode == Mode::Read)
    {
        m_Profiler.m_Timers.emplace("read", profiling::Timer("read", timeUnit));
        m_Profiler.m_Bytes.emplace("read", 0);
    }

    m_Profiler.m_Timers.emplace("close", profiling::Timer("close", TimeUnit::Microseconds));
}